

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscroll.c
# Opt level: O1

void Scroll(DspInterface dsp,int newX,int newY)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = (dsp->Visible).width;
  uVar2 = (dsp->Display).width;
  iVar5 = uVar2 - uVar1;
  if (newX < iVar5) {
    iVar5 = newX;
  }
  if (newX < 1) {
    iVar5 = 0;
  }
  uVar3 = (dsp->Display).height;
  (dsp->Visible).x = iVar5;
  uVar4 = (dsp->Visible).height;
  iVar6 = uVar3 - uVar4;
  if (newY < iVar6) {
    iVar6 = newY;
  }
  if (newY < 1) {
    iVar6 = 0;
  }
  (dsp->Visible).y = iVar6;
  XMoveWindow(dsp->display_id,dsp->HorScrollButton,
              (long)(int)(iVar5 * uVar1) / (long)(int)uVar2 & 0xffffffff,-dsp->InternalBorderWidth);
  XMoveWindow(dsp->display_id,dsp->VerScrollButton,-dsp->InternalBorderWidth,
              (long)(int)(iVar6 * uVar4) / (long)(int)uVar3 & 0xffffffff);
  (*dsp->bitblt_to_screen)
            (dsp,(DLword *)0x0,(dsp->Visible).x,(dsp->Visible).y,(dsp->Visible).width,
             (dsp->Visible).height);
  return;
}

Assistant:

void Scroll(DspInterface dsp, int newX, int newY)
{
  /* Limit the newX and newY values. */
  dsp->Visible.x = sbound(0, newX, dsp->Display.width - dsp->Visible.width);
  dsp->Visible.y = sbound(0, newY, dsp->Display.height - dsp->Visible.height);

  newX = (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width;
  newY = (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height;

  XMoveWindow(dsp->display_id, dsp->HorScrollButton, newX, -(int)dsp->InternalBorderWidth);
  XMoveWindow(dsp->display_id, dsp->VerScrollButton, -(int)dsp->InternalBorderWidth, newY);

  (dsp->bitblt_to_screen)(dsp, 0, dsp->Visible.x, dsp->Visible.y, dsp->Visible.width,
                          dsp->Visible.height);
}